

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O3

bool __thiscall cmCTestVC::Update(cmCTestVC *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *extraout_RDX;
  byte bVar6;
  string_view value;
  string versionOverride;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar2 = this->CTest;
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"UpdateVersionOverride","");
  cmCTest::GetCTestConfiguration(&local_48,pcVar2,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_48._M_string_length == 0) {
    pcVar2 = this->CTest;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"UpdateVersionOnly","");
    cmCTest::GetCTestConfiguration(&local_88,pcVar2,&local_68);
    value._M_str = extraout_RDX;
    value._M_len = (size_t)local_88._M_dataplus._M_p;
    bVar3 = cmValue::IsOn((cmValue *)local_88._M_string_length,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar6 = 1;
    if (!bVar3) {
      iVar4 = (*this->_vptr_cmCTestVC[3])(this);
      std::__ostream_insert<char,std::char_traits<char>>(this->Log,"--- Begin Update ---\n",0x15);
      iVar5 = (*this->_vptr_cmCTestVC[4])(this);
      std::__ostream_insert<char,std::char_traits<char>>(this->Log,"--- End Update ---\n",0x13);
      bVar6 = (byte)iVar4 & (byte)iVar5;
    }
    iVar4 = (*this->_vptr_cmCTestVC[5])(this);
    bVar6 = bVar6 & (byte)iVar4;
  }
  else {
    bVar6 = 1;
    (*this->_vptr_cmCTestVC[6])(this,&local_48);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (bool)bVar6;
}

Assistant:

bool cmCTestVC::Update()
{
  bool result = true;

  // Use the explicitly specified version.
  std::string versionOverride =
    this->CTest->GetCTestConfiguration("UpdateVersionOverride");
  if (!versionOverride.empty()) {
    this->SetNewRevision(versionOverride);
    return true;
  }

  // if update version only is on then do not actually update,
  // just note the current version and finish
  if (!cmIsOn(this->CTest->GetCTestConfiguration("UpdateVersionOnly"))) {
    result = this->NoteOldRevision() && result;
    this->Log << "--- Begin Update ---\n";
    result = this->UpdateImpl() && result;
    this->Log << "--- End Update ---\n";
  }
  result = this->NoteNewRevision() && result;
  return result;
}